

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O3

bool __thiscall ON_Annotation::GetText3dCorners(ON_Annotation *this,ON_3dPoint *corners)

{
  bool bVar1;
  
  if ((corners != (ON_3dPoint *)0x0) && (this->m_text != (ON_TextContent *)0x0)) {
    bVar1 = ON_TextContent::Get3dCorners(this->m_text,corners);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_Annotation::GetText3dCorners(ON_3dPoint corners[4]) const
{
  if (nullptr == corners)
    return false;
  const ON_TextContent* text_geom = Text();
  if (nullptr == text_geom)
    return false;
  return text_geom->Get3dCorners(corners);
}